

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float fVar2;
  char *pcVar3;
  pointer pcVar4;
  size_type sVar5;
  int iVar6;
  int iVar7;
  istream *piVar8;
  size_t sVar9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var10;
  pointer pbVar11;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var12;
  ostream *poVar13;
  size_t sVar14;
  int iVar15;
  float *pfVar16;
  int *piVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  undefined8 in_R8;
  int iVar24;
  int iVar25;
  size_type sVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> final_boxes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  final_words;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lex;
  vector<float,_std::allocator<float>_> final_confs;
  vector<float,_std::allocator<float>_> confidences;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  vector<cv::Mat,_std::allocator<cv::Mat>_> channels;
  string output;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> nm_boxes;
  vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
  regions;
  Ptr<cv::text::OCRTesseract> ocr;
  Ptr<cv::text::ERFilter> er_filter2;
  Ptr<cv::text::ERFilter> er_filter1;
  Mat m;
  vector<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
  nm_region_groups;
  Mat grey;
  Mat image;
  ifstream infile;
  string *psVar30;
  undefined1 local_4f9;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> local_4f8;
  uint local_4dc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b8;
  ulong local_4a0;
  void *local_498;
  iterator iStack_490;
  float *local_488;
  ulong local_480;
  void *local_478;
  pointer pbStack_470;
  Size SStack_468;
  pointer local_458;
  pointer pbStack_450;
  Size SStack_448;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_438;
  _InputArray local_418;
  undefined8 uStack_400;
  void *local_3f8;
  long lStack_3f0;
  long local_3e8;
  vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
  local_3d8;
  vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_> local_3c0;
  long *local_3a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3a0;
  long *local_398;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_390;
  long *local_388;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_380;
  undefined1 local_378 [96];
  vector<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
  local_318;
  value_type local_2f8 [3];
  Mat local_298 [8];
  int local_290;
  int local_28c;
  Mat *local_238;
  Mat *pMStack_230;
  ulong local_228 [12];
  Mat local_1c8 [96];
  Mat local_168 [312];
  
  cv::Mat::Mat(local_298);
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    Usage: ",0xb);
    pcVar3 = *argv;
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10c128);
    }
    else {
      sVar9 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," <input_image> [<input_txt_lexicon>]",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2f8,argv[1],(allocator<char> *)local_378);
    cv::imread((string *)&local_238,(int)local_2f8);
    cv::Mat::operator=(local_298,(Mat *)&local_238);
    cv::Mat::~Mat((Mat *)&local_238);
    paVar1 = &local_2f8[0].field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f8[0]._M_dataplus._M_p,
                      CONCAT71(local_2f8[0].field_2._M_allocated_capacity._1_7_,
                               local_2f8[0].field_2._M_local_buf[0]) + 1);
    }
    iVar15 = (int)in_R8;
    local_4b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_4b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_4b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (argc != 2) {
      std::ifstream::ifstream(&local_238,argv[2],_S_in);
      local_2f8[0]._M_string_length = 0;
      local_2f8[0].field_2._M_local_buf[0] = '\0';
      local_2f8[0]._M_dataplus._M_p = (pointer)paVar1;
      while( true ) {
        piVar8 = std::operator>>((istream *)&local_238,(string *)local_2f8);
        iVar15 = (int)in_R8;
        if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_4b8,local_2f8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_2f8[0]._M_dataplus._M_p,
                        CONCAT71(local_2f8[0].field_2._M_allocated_capacity._1_7_,
                                 local_2f8[0].field_2._M_local_buf[0]) + 1);
      }
      std::ifstream::~ifstream(&local_238);
    }
    local_438.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_438.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_438.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    cv::Mat::Mat((Mat *)local_2f8);
    local_228[0] = 0;
    local_238 = (Mat *)CONCAT44(local_238._4_4_,0x1010000);
    pMStack_230 = local_298;
    local_378._16_4_ = 0;
    local_378._20_4_ = 0;
    local_378._0_4_ = 0x2010000;
    local_378._8_8_ = local_2f8;
    cv::cvtColor((cv *)&local_238,(_InputArray *)local_378,(_OutputArray *)0x7,0,iVar15);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::push_back(&local_438,(value_type *)local_2f8);
    local_418._0_8_ = (char *)0x406fe00000000000;
    local_418.obj = (void *)0x0;
    local_418.sz.width = 0;
    local_418.sz.height = 0;
    uStack_400 = 0;
    cv::operator-((Scalar_ *)&local_238,(Mat *)&local_418);
    cv::Mat::Mat((Mat *)local_378);
    (**(code **)(*(long *)local_238 + 0x18))(local_238,&local_238,(Mat *)local_378,0xffffffff);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::emplace_back<cv::Mat>
              (&local_438,(Mat *)local_378);
    cv::Mat::~Mat((Mat *)local_378);
    cv::Mat::~Mat(local_168);
    cv::Mat::~Mat(local_1c8);
    cv::Mat::~Mat((Mat *)local_228);
    local_238 = (Mat *)local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,"trained_classifierNM1.xml","");
    cv::text::loadClassifierNM1((string *)local_378);
    cv::text::createERFilterNM1((Ptr *)&local_388,(int)local_378,0.00015,0.13,0.2,true,0.1);
    if ((value_type *)local_378._8_8_ != (value_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_378._8_8_);
    }
    if (local_238 != (Mat *)local_228) {
      operator_delete(local_238,local_228[0] + 1);
    }
    local_238 = (Mat *)local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,"trained_classifierNM2.xml","");
    cv::text::loadClassifierNM2((string *)local_378);
    cv::text::createERFilterNM2((Ptr *)&local_398,0.5);
    if ((value_type *)local_378._8_8_ != (value_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_378._8_8_);
    }
    if (local_238 != (Mat *)local_228) {
      operator_delete(local_238,local_228[0] + 1);
    }
    std::
    vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
    ::vector(&local_3d8,
             ((long)local_438.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_438.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start >> 5) * -0x5555555555555555,
             (allocator_type *)&local_238);
    if (0 < (int)((ulong)((long)local_438.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_438.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 5) * -0x55555555) {
      lVar18 = 0;
      lVar28 = 0;
      lVar19 = 0;
      do {
        pMStack_230 = local_438.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar28;
        local_228[0] = 0;
        local_238._0_4_ = 0x1010000;
        (**(code **)(*local_388 + 0x40))
                  (local_388,&local_238,
                   (long)&((local_3d8.
                            super__Vector_base<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>).
                          _M_impl.super__Vector_impl_data._M_start + lVar18);
        pMStack_230 = local_438.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar28;
        local_228[0] = 0;
        local_238 = (Mat *)CONCAT44(local_238._4_4_,0x1010000);
        (**(code **)(*local_398 + 0x40))
                  (local_398,&local_238,
                   (long)&((local_3d8.
                            super__Vector_base<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>).
                          _M_impl.super__Vector_impl_data._M_start + lVar18);
        lVar19 = lVar19 + 1;
        lVar28 = lVar28 + 0x60;
        lVar18 = lVar18 + 0x18;
      } while (lVar19 < (int)((ulong)((long)local_438.
                                            super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_438.
                                           super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                           _M_impl.super__Vector_impl_data._M_start) >> 5) *
                        -0x55555555);
    }
    local_4d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_488 = (float *)0x0;
    local_498 = (void *)0x0;
    iStack_490._M_current = (float *)0x0;
    local_318.
    super__Vector_base<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_318.
    super__Vector_base<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_318.
    super__Vector_base<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3e8 = 0;
    local_3f8 = (void *)0x0;
    lStack_3f0 = 0;
    local_378._16_4_ = 0;
    local_378._20_4_ = 0;
    local_378._0_4_ = 0x1010000;
    local_378._8_8_ = local_298;
    local_418.sz.width = 0;
    local_418.sz.height = 0;
    local_418.flags = 0x1050000;
    pMStack_230 = (Mat *)0x0;
    local_228[0] = local_228[0] & 0xffffffffffffff00;
    psVar30 = (string *)&local_238;
    local_418.obj = &local_438;
    local_238 = (Mat *)local_228;
    cv::text::erGrouping
              ((_InputArray *)local_378,&local_418,(vector *)&local_3d8,(vector *)&local_318,
               (vector *)&local_3f8,0,psVar30,0.5);
    if (local_238 != (Mat *)local_228) {
      operator_delete(local_238,local_228[0] + 1);
    }
    cv::text::OCRTesseract::create((char *)&local_3a8,(char *)0x0,(char *)0x0,0,3);
    local_418._0_8_ = &local_418.sz;
    local_418.obj = (char *)0x0;
    local_418.sz = (Size)((ulong)local_418.sz & 0xffffffffffffff00);
    if (0 < (int)((ulong)(lStack_3f0 - (long)local_3f8) >> 4)) {
      uVar20 = 0;
      do {
        cv::Mat::zeros((int)(Mat *)&local_238,local_290 + 2,local_28c + 2);
        cv::Mat::Mat((Mat *)local_378);
        (**(code **)(*(long *)local_238 + 0x18))
                  (local_238,(Mat *)&local_238,(pointer)local_378,0xffffffff);
        cv::Mat::~Mat(local_168);
        cv::Mat::~Mat(local_1c8);
        cv::Mat::~Mat((Mat *)local_228);
        std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>::vector
                  (&local_3c0,
                   local_318.
                   super__Vector_base<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar20);
        er_draw(&local_438,&local_3d8,&local_3c0,(Mat *)local_378);
        if (local_3c0.super__Vector_base<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_3c0.
                          super__Vector_base<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_3c0.
                                super__Vector_base<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_3c0.
                                super__Vector_base<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        local_4a0 = uVar20 * 0x10;
        cv::Mat::Mat((Mat *)&local_238,(Mat *)local_378,(Rect_ *)((long)local_3f8 + local_4a0));
        SStack_448.width = 0;
        SStack_448.height = 0;
        local_458._0_4_ = 0x2010000;
        pbStack_450 = (pointer)local_378;
        cv::Mat::copyTo((_OutputArray *)&local_238);
        cv::Mat::~Mat((Mat *)&local_238);
        SStack_448.width = 0;
        SStack_448.height = 0;
        local_458 = (pointer)CONCAT44(local_458._4_4_,0x1010000);
        SStack_468.width = 0;
        SStack_468.height = 0;
        local_478 = (void *)CONCAT44(local_478._4_4_,0x2010000);
        local_228[0] = 0;
        local_228[1] = 0;
        local_238 = (Mat *)0x0;
        pMStack_230 = (Mat *)0x0;
        uVar22 = (ulong)psVar30 & 0xffffffff00000000;
        pbStack_470 = (pointer)local_378;
        pbStack_450 = (pointer)local_378;
        cv::copyMakeBorder((_InputArray *)&local_458,(_OutputArray *)&local_478,0xf,0xf,0xf,0xf,0,
                           (Scalar_ *)&local_238);
        local_228[0] = 0;
        local_238 = (Mat *)0x0;
        pMStack_230 = (Mat *)0x0;
        SStack_448.width = 0;
        SStack_448.height = 0;
        local_458 = (pointer)0x0;
        pbStack_450 = (pointer)0x0;
        SStack_468.width = 0;
        SStack_468.height = 0;
        local_478 = (void *)0x0;
        pbStack_470 = (pointer)0x0;
        psVar30 = (string *)(uVar22 & 0xffffffff00000000);
        (**(code **)(*local_3a8 + 0x10))
                  (local_3a8,(pointer)local_378,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_418,(Mat *)&local_238,(_InputArray *)&local_458,
                   (_OutputArray *)&local_478,psVar30);
        local_4f9 = 10;
        local_480 = uVar20;
        _Var10 = std::
                 __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )local_418._0_8_,(char *)((long)local_418.obj + local_418._0_8_),
                            (_Iter_equals_val<const_char>)&local_4f9);
        local_418.obj = _Var10._M_current + -local_418._0_8_;
        *_Var10._M_current = '\0';
        if (((char *)0x2 < local_418.obj) &&
           (0 < (int)((ulong)((long)pMStack_230 - (long)local_238) >> 4))) {
          lVar18 = 0;
          do {
            lVar19 = lVar18 * 0x10;
            *(ulong *)(local_238 + lVar19) =
                 CONCAT44((int)((ulong)*(undefined8 *)(local_238 + lVar19) >> 0x20) +
                          (int)((ulong)*(undefined8 *)((long)local_3f8 + local_4a0) >> 0x20) + -0xf,
                          (int)*(undefined8 *)(local_238 + lVar19) +
                          (int)*(undefined8 *)((long)local_3f8 + local_4a0) + -0xf);
            uVar20 = local_458[lVar18]._M_string_length;
            if ((((1 < uVar20) && (fVar2 = *(float *)((long)local_478 + lVar18 * 4), 51.0 <= fVar2))
                && ((pbVar11 = local_458 + lVar18, uVar20 != 2 ||
                    (pcVar3 = (pbVar11->_M_dataplus)._M_p, *pcVar3 != pcVar3[1])))) &&
               ((3 < uVar20 || (60.0 <= fVar2)))) {
              uVar27 = (uint)uVar20;
              if ((int)uVar27 < 1) {
                iVar15 = 0;
              }
              else {
                uVar22 = 0;
                iVar15 = 0;
                do {
                  uVar23 = (byte)(pbVar11->_M_dataplus)._M_p[uVar22] - 0x49;
                  if ((uVar23 < 0x24) && ((0x900000001U >> ((ulong)uVar23 & 0x3f) & 1) != 0)) {
                    iVar15 = iVar15 + 1;
                  }
                  uVar22 = uVar22 + 1;
                } while ((uVar27 & 0x7fffffff) != uVar22);
              }
              if (iVar15 <= (int)((uVar27 - ((int)(uVar27 + 1) >> 0x1f)) + 1) >> 1) {
                if (local_4b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    local_4b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  pcVar4 = (pbVar11->_M_dataplus)._M_p;
                  uVar22 = 0;
                  do {
                    iVar15 = toupper((int)pcVar4[uVar22]);
                    pcVar4[uVar22] = (char)iVar15;
                    uVar22 = uVar22 + 1;
                  } while (uVar20 != uVar22);
                  _Var12 = std::
                           __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                     (local_4b8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      local_4b8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,local_458 + lVar18)
                  ;
                  if (_Var12._M_current ==
                      local_4b8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    *(undefined4 *)((long)local_478 + lVar18 * 4) = 0x43480000;
                  }
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_4d8,local_458 + lVar18);
                std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::push_back
                          (&local_4f8,(value_type *)(local_238 + lVar19));
                pfVar16 = (float *)(lVar18 * 4 + (long)local_478);
                if (iStack_490._M_current == local_488) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&local_498,iStack_490,pfVar16);
                }
                else {
                  *iStack_490._M_current = *pfVar16;
                  iStack_490._M_current = iStack_490._M_current + 1;
                }
              }
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 < (int)((ulong)((long)pMStack_230 - (long)local_238) >> 4));
        }
        if (local_478 != (void *)0x0) {
          operator_delete(local_478,(long)SStack_468 - (long)local_478);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_458);
        uVar20 = local_480;
        if (local_238 != (Mat *)0x0) {
          operator_delete(local_238,local_228[0] - (long)local_238);
        }
        cv::Mat::~Mat((Mat *)local_378);
        uVar20 = uVar20 + 1;
      } while ((long)uVar20 < (long)(int)((ulong)(lStack_3f0 - (long)local_3f8) >> 4));
    }
    if (local_4d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_4d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar22 = 0;
      uVar20 = 0;
      do {
        local_4dc = (int)uVar20 + 1;
        uVar29 = (ulong)(int)local_4dc;
        uVar27 = 0xffffffff;
        local_4a0 = uVar22;
        local_480 = uVar20;
        uVar23 = local_4dc;
        if (uVar29 < (ulong)((long)local_4d8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_4d8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          do {
            iVar15 = local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar22].x;
            iVar24 = local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar22].y;
            iVar21 = local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar29].x;
            iVar25 = local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar29].y;
            iVar6 = iVar21;
            if (iVar21 < iVar15) {
              iVar6 = iVar15;
            }
            iVar7 = iVar25;
            if (iVar25 < iVar24) {
              iVar7 = iVar24;
            }
            iVar15 = iVar15 + local_4f8.
                              super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar22].width;
            iVar21 = iVar21 + local_4f8.
                              super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar29].width;
            if (iVar15 <= iVar21) {
              iVar21 = iVar15;
            }
            iVar24 = iVar24 + local_4f8.
                              super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar22].height;
            iVar25 = iVar25 + local_4f8.
                              super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar29].height;
            if (iVar24 <= iVar25) {
              iVar25 = iVar24;
            }
            iVar15 = (iVar25 - iVar7) * (iVar21 - iVar6);
            if (iVar25 - iVar7 < 1) {
              iVar15 = 0;
            }
            if (iVar21 - iVar6 < 1) {
              iVar15 = 0;
            }
            iVar24 = local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar22].height *
                     local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar22].width;
            iVar21 = local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar29].height *
                     local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar29].width;
            if (((0.5 < (float)iVar15 / (float)((iVar21 + iVar24) - iVar15)) ||
                ((double)iVar24 * 0.8 < (double)iVar15)) || ((double)iVar21 * 0.8 < (double)iVar15))
            {
              fVar2 = *(float *)((long)local_498 + uVar29 * 4);
              pfVar16 = (float *)((long)local_498 + local_4a0 * 4);
              uVar27 = uVar23;
              if (*pfVar16 <= fVar2 && fVar2 != *pfVar16) {
                uVar27 = (uint)local_480;
              }
              iVar15 = 0xf;
              if (uVar27 == uVar23) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_erase(&local_4d8,
                           local_4d8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar29);
                if ((local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar29 + 1 !=
                     local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish) &&
                   (lVar18 = (long)local_4f8.
                                   super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(local_4f8.
                                    super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar29 + 1) >> 4,
                   0 < lVar18)) {
                  lVar18 = lVar18 + 1;
                  piVar17 = &local_4f8.
                             super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar29 + 1].height;
                  do {
                    *(Rect_<int> *)(piVar17 + -7) = *(Rect_<int> *)(piVar17 + -3);
                    lVar18 = lVar18 + -1;
                    piVar17 = piVar17 + 4;
                  } while (1 < lVar18);
                }
                local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish + -1;
                pfVar16 = (float *)((long)local_498 + uVar29 * 4 + 4);
                if (pfVar16 != iStack_490._M_current) {
                  memmove((void *)((long)local_498 + uVar29 * 4),pfVar16,
                          (long)iStack_490._M_current - (long)pfVar16);
                }
                iStack_490._M_current = iStack_490._M_current + -1;
                iVar15 = 0;
              }
            }
            else {
              uVar23 = uVar23 + 1;
              iVar15 = 0;
              uVar27 = 0xffffffff;
            }
          } while ((iVar15 == 0) &&
                  (uVar29 = (ulong)(int)uVar23,
                  uVar29 < (ulong)((long)local_4d8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_4d8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5)));
        }
        uVar20 = local_4a0;
        uVar23 = (uint)local_480;
        if (uVar27 == uVar23) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase(&local_4d8,
                     local_4d8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + local_4a0);
          if ((local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar20 + 1 !=
               local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish) &&
             (lVar18 = (long)local_4f8.
                             super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_4f8.
                              super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                              _M_impl.super__Vector_impl_data._M_start + uVar20 + 1) >> 4,
             0 < lVar18)) {
            lVar18 = lVar18 + 1;
            piVar17 = &local_4f8.
                       super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar20 + 1].height;
            do {
              *(Rect_<int> *)(piVar17 + -7) = *(Rect_<int> *)(piVar17 + -3);
              lVar18 = lVar18 + -1;
              piVar17 = piVar17 + 4;
            } while (1 < lVar18);
          }
          local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish + -1;
          pfVar16 = (float *)((long)local_498 + uVar20 * 4 + 4);
          if (pfVar16 != iStack_490._M_current) {
            memmove((void *)((long)local_498 + uVar20 * 4),pfVar16,
                    (long)iStack_490._M_current - (long)pfVar16);
          }
          iStack_490._M_current = iStack_490._M_current + -1;
          local_4dc = uVar23;
        }
        uVar20 = (ulong)local_4dc;
        uVar22 = (ulong)(int)local_4dc;
      } while (uVar22 < (ulong)((long)local_4d8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_4d8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    if (local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar20 = 0;
      do {
        if (local_4b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_4b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
LAB_001053c0:
          poVar13 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)&std::cout,
                               local_4f8.
                               super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar20].x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
          poVar13 = (ostream *)
                    std::ostream::operator<<
                              (poVar13,local_4f8.
                                       super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar20].y);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
          iVar24 = local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar20].width +
                   local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar20].x;
          iVar15 = local_28c + -2;
          if (iVar24 <= local_28c + -2) {
            iVar15 = iVar24;
          }
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar15);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
          poVar13 = (ostream *)
                    std::ostream::operator<<
                              (poVar13,local_4f8.
                                       super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar20].y);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
          iVar24 = local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar20].width +
                   local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar20].x;
          iVar15 = local_28c + -2;
          if (iVar24 <= local_28c + -2) {
            iVar15 = iVar24;
          }
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar15);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
          iVar24 = local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar20].height +
                   local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar20].y;
          iVar15 = local_290 + -2;
          if (iVar24 <= local_290 + -2) {
            iVar15 = iVar24;
          }
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar15);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
          poVar13 = (ostream *)
                    std::ostream::operator<<
                              (poVar13,local_4f8.
                                       super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar20].x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
          iVar24 = local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar20].height +
                   local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar20].y;
          iVar15 = local_290 + -2;
          if (iVar24 <= local_290 + -2) {
            iVar15 = iVar24;
          }
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar15);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,local_4d8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar20]._M_dataplus
                                       ._M_p,
                               local_4d8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar20]._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
          std::ostream::put((char)poVar13);
          std::ostream::flush();
        }
        else {
          sVar5 = local_4d8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar20]._M_string_length;
          if (sVar5 != 0) {
            pcVar4 = local_4d8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar20]._M_dataplus._M_p;
            sVar26 = 0;
            do {
              iVar15 = toupper((int)pcVar4[sVar26]);
              pcVar4[sVar26] = (char)iVar15;
              sVar26 = sVar26 + 1;
            } while (sVar5 != sVar26);
          }
          _Var12 = std::
                   __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                             (local_4b8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              local_4b8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                              local_4d8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar20);
          if (_Var12._M_current !=
              local_4b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001053c0;
          iVar15 = (int)local_4d8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar20]._M_string_length;
          if (local_4b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_4b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            lVar18 = 0;
            uVar22 = 0;
            do {
              sVar14 = edit_distance((string *)
                                     ((long)&((local_4b8.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar18),
                                     local_4d8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar20);
              if ((int)sVar14 <= iVar15) {
                iVar15 = (int)sVar14;
              }
              uVar22 = uVar22 + 1;
              lVar18 = lVar18 + 0x20;
            } while (uVar22 < (ulong)((long)local_4b8.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_4b8.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          uVar22 = local_4d8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar20]._M_string_length;
          if (((ulong)(long)iVar15 < uVar22) &&
             (std::__cxx11::string::_M_assign
                        ((string *)
                         (local_4d8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar20)),
             (ulong)(long)iVar15 < uVar22)) goto LAB_001053c0;
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < (ulong)((long)local_4f8.
                                      super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_4f8.
                                      super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    if ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_418._0_8_ !=
        (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_418.sz) {
      operator_delete((void *)local_418._0_8_,(long)local_418.sz + 1);
    }
    if (local_3a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0);
    }
    if (local_3f8 != (void *)0x0) {
      operator_delete(local_3f8,local_3e8 - (long)local_3f8);
    }
    std::
    vector<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
    ::~vector(&local_318);
    if (local_498 != (void *)0x0) {
      operator_delete(local_498,(long)local_488 - (long)local_498);
    }
    if (local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4f8.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_4f8.
                            super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_4f8.
                            super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_4d8);
    std::
    vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
    ::~vector(&local_3d8);
    if (local_390 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_390);
    }
    if (local_380 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_380);
    }
    cv::Mat::~Mat((Mat *)local_2f8);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_438);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_4b8);
  }
  cv::Mat::~Mat(local_298);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{

    Mat image;
    if(argc>1)
    {
        image  = imread(argv[1]);
    }
    else
    {
        cout << "    Usage: " << argv[0] << " <input_image> [<input_txt_lexicon>]" << endl;
        return(0);
    }

    // Load lexicon if provided
    vector<string> lex;
    if(argc>2)
    {
        ifstream infile(argv[2]);
        string lex_word;
        while (infile >> lex_word)
        {
            lex.push_back(lex_word);
        }
    }

    /*Text Detection*/

    // Extract channels to be processed individually
    vector<Mat> channels;

    Mat grey;
    cvtColor(image,grey,COLOR_RGB2GRAY);


    // Extract channels to be processed individually
    // computeNMChannels(image, channels);
    // Notice here we are only using grey channel.
    channels.push_back(grey);
    channels.push_back(255-grey);

    // Create ERFilter objects with the 1st and 2nd stage default classifiers
    Ptr<ERFilter> er_filter1 = createERFilterNM1(loadClassifierNM1("trained_classifierNM1.xml"),8,0.00015f,0.13f,0.2f,true,0.1f);
    Ptr<ERFilter> er_filter2 = createERFilterNM2(loadClassifierNM2("trained_classifierNM2.xml"),0.5);

    vector<vector<ERStat> > regions(channels.size());
    // Apply the default cascade classifier to each independent channel
    for (int c=0; c<(int)channels.size(); c++)
    {
        er_filter1->run(channels[c], regions[c]);
        er_filter2->run(channels[c], regions[c]);
    }

    vector<string> final_words;
    vector<Rect>   final_boxes;
    vector<float>  final_confs;


    // Detect character groups
    vector< vector<Vec2i> > nm_region_groups;
    vector<Rect> nm_boxes;
    erGrouping(image, channels, regions, nm_region_groups, nm_boxes,ERGROUPING_ORIENTATION_HORIZ);



    /*Text Recognition (OCR)*/

    Ptr<OCRTesseract> ocr = OCRTesseract::create();
    string output;


    for (int i=0; i<(int)nm_boxes.size(); i++)
    {

        Mat group_img = Mat::zeros(image.rows+2, image.cols+2, CV_8UC1);
        er_draw(channels, regions, nm_region_groups[i], group_img);
        group_img(nm_boxes[i]).copyTo(group_img);
        copyMakeBorder(group_img,group_img,15,15,15,15,BORDER_CONSTANT,Scalar(0));

        vector<Rect>   boxes;
        vector<string> words;
        vector<float>  confidences;
        ocr->run(group_img, output, &boxes, &words, &confidences, OCR_LEVEL_WORD);

        output.erase(remove(output.begin(), output.end(), '\n'), output.end());
        //cout << "OCR output = \"" << output << "\" lenght = " << output.size() << endl;
        if (output.size() < 3)
            continue;

        for (int j=0; j<(int)boxes.size(); j++)
        {
            boxes[j].x += nm_boxes[i].x-15;
            boxes[j].y += nm_boxes[i].y-15;

            /* Filter words with low confidence, or less than 3 chars, or noisy recognitions */
            // Threshold values have been set using the ICDAR train set.
            //cout << "  word = " << words[j] << "\t confidence = " << confidences[j] << endl;
            if ((words[j].size() < 2) || (confidences[j] < 51) ||
                    ((words[j].size()==2) && (words[j][0] == words[j][1])) ||
                    ((words[j].size()< 4) && (confidences[j] < 60)) ||
                    isRepetitive(words[j]))
                continue;

            /* Increase confidence of predicted words matching a word in the lexicon */
            if (lex.size() > 0)
            {
                std::transform(words[j].begin(), words[j].end(), words[j].begin(), ::toupper);
                if (find(lex.begin(), lex.end(), words[j]) == lex.end())
                    confidences[j] = 200;
            }

            final_words.push_back(words[j]);
            final_boxes.push_back(boxes[j]);
            final_confs.push_back(confidences[j]);
        }

    }


    /* Non Maximal Suppression using OCR confidence */
    float thr = 0.5;

    for (int i=0; i<final_words.size(); )
    {
        int to_delete = -1;
        for (int j=i+1; j<final_words.size(); )
        {
            to_delete = -1;
            Rect intersection = final_boxes[i] & final_boxes[j];
            float IoU = (float)intersection.area() / (final_boxes[i].area() + final_boxes[j].area() - intersection.area());
            if ((IoU > thr) || (intersection.area() > 0.8*final_boxes[i].area()) || (intersection.area() > 0.8*final_boxes[j].area()))
            {
                // if regions overlap more than thr delete the one with lower confidence
                to_delete = (final_confs[i] < final_confs[j]) ? i : j;

                if (to_delete == j )
                {
                    final_words.erase(final_words.begin()+j);
                    final_boxes.erase(final_boxes.begin()+j);
                    final_confs.erase(final_confs.begin()+j);
                    continue;
                } else {
                    break;
                }
            }
            j++;
        }
        if (to_delete == i )
        {
            final_words.erase(final_words.begin()+i);
            final_boxes.erase(final_boxes.begin()+i);
            final_confs.erase(final_confs.begin()+i);
            continue;
        }
        i++;
    }

    /* Predicted words which are not in the lexicon are filtered
       or changed to match one (when edit distance ratio < 0.34)*/
    float max_edit_distance_ratio = 0.34;
    for (int j=0; j<final_boxes.size(); j++)
    {

        if (lex.size() > 0)
        {
            std::transform(final_words[j].begin(), final_words[j].end(), final_words[j].begin(), ::toupper);
            if (find(lex.begin(), lex.end(), final_words[j]) == lex.end())
            {
                int best_match = -1;
                int best_dist  = final_words[j].size();
                for (int l=0; l<lex.size(); l++)
                {
                    int dist = edit_distance(lex[l],final_words[j]);
                    if (dist < best_dist)
                    {
                        best_match = l;
                        best_dist = dist;
                    }
                }
                if (best_dist/final_words[j].size() < max_edit_distance_ratio)
                    final_words[j] = lex[best_match];
                else
                    continue;
            }
        }

        // Output final recognition in csv format compatible with the ICDAR Robust Reading Competition
        cout << final_boxes[j].tl().x << ","
             << final_boxes[j].tl().y << ","
             << min(final_boxes[j].br().x,image.cols-2)
             << "," << final_boxes[j].tl().y << ","
             << min(final_boxes[j].br().x,image.cols-2) << ","
             << min(final_boxes[j].br().y,image.rows-2) << ","
             << final_boxes[j].tl().x << ","
             << min(final_boxes[j].br().y,image.rows-2) << ","
             << final_words[j] << endl ;
    }

    return 0;
}